

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getOptionType(Highs *this,string *option,HighsOptionType *type)

{
  OptionStatus OVar1;
  HighsOptionType *in_RDX;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RSI;
  string *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  HighsStatus HVar2;
  
  OVar1 = getLocalOptionType((HighsLogOptions *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             in_RSI,in_RDX);
  if (OVar1 == kOk) {
    HVar2 = kOk;
  }
  else {
    HVar2 = kError;
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::getOptionType(const std::string& option,
                                 HighsOptionType* type) const {
  if (getLocalOptionType(options_.log_options, option, options_.records,
                         type) == OptionStatus::kOk)
    return HighsStatus::kOk;
  return HighsStatus::kError;
}